

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkTransRel(Abc_Ntk_t *pNtk,int fInputs,int fVerbose)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  Abc_Ntk_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  Vec_Ptr_t *pVVar12;
  long in_RCX;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  Abc_Ntk_t *pNtkNew;
  char Buffer [1000];
  Abc_Ntk_t *local_430;
  uint local_428;
  int local_424;
  Abc_Ntk_t *local_420;
  char local_418 [1000];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xa8,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  iVar13 = pNtk->nObjCounts[8];
  lVar14 = (long)iVar13;
  local_424 = fInputs;
  if (lVar14 == 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xa9,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  pAVar6 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  local_430 = pAVar6;
  sprintf(local_418,"%s_TR",pNtk->pName);
  pcVar7 = Extra_UtilStrsav(pNtk->pName);
  pAVar6->pName = pcVar7;
  Abc_NtkCleanCopy(pNtk);
  pVVar10 = pNtk->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      plVar1 = (long *)pVVar10->pArray[lVar16];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        pAVar9 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        pAVar8 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_PI);
        (pAVar9->field_6).pCopy = pAVar8;
        pcVar7 = Abc_ObjName(pAVar9);
        Abc_ObjAssignName(pAVar8,pcVar7,(char *)0x0);
      }
      lVar16 = lVar16 + 1;
      pVVar10 = pNtk->vBoxes;
      in_RCX = (long)pVVar10->nSize;
    } while (lVar16 < in_RCX);
  }
  pVVar10 = pNtk->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      plVar1 = (long *)pVVar10->pArray[lVar16];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        pAVar9 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        pAVar8 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_PI);
        pcVar7 = Abc_ObjName(pAVar9);
        Abc_ObjAssignName(pAVar8,pcVar7,(char *)0x0);
      }
      lVar16 = lVar16 + 1;
      pVVar10 = pNtk->vBoxes;
      in_RCX = (long)pVVar10->nSize;
    } while (lVar16 < in_RCX);
  }
  pVVar10 = pNtk->vPis;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      Abc_NtkDupObj(pAVar6,(Abc_Obj_t *)pVVar10->pArray[lVar16],1);
      lVar16 = lVar16 + 1;
      pVVar10 = pNtk->vPis;
      in_RCX = (long)pVVar10->nSize;
    } while (lVar16 < in_RCX);
  }
  Abc_NtkCreateObj(pAVar6,ABC_OBJ_PO);
  pAVar9 = Abc_AigConst1(pAVar6);
  pAVar8 = Abc_AigConst1(pNtk);
  (pAVar8->field_6).pCopy = pAVar9;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      plVar1 = (long *)pVVar10->pArray[lVar16];
      if ((plVar1 != (long *)0x0) && (uVar5 = *(uint *)((long)plVar1 + 0x14), (uVar5 & 0xf) == 7)) {
        lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
        pAVar9 = Abc_AigAnd((Abc_Aig_t *)pAVar6->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(uVar5 >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(uVar5 >> 0xb & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40)));
        plVar1[8] = (long)pAVar9;
      }
      lVar16 = lVar16 + 1;
      pVVar10 = pNtk->vObjs;
      in_RCX = (long)pVVar10->nSize;
    } while (lVar16 < in_RCX);
  }
  if (pNtk->vBoxes->nSize != pNtk->nObjCounts[8]) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0xc5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
  }
  uVar15 = iVar13 * 2;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  uVar5 = 8;
  if (8 < uVar15) {
    uVar5 = uVar15;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = uVar5;
  local_428 = uVar15;
  ppvVar11 = (void **)malloc((long)(int)uVar5 << 3);
  pVVar10->pArray = ppvVar11;
  pVVar12 = pNtk->vBoxes;
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    local_420 = pAVar6;
    do {
      plVar1 = (long *)pVVar12->pArray[lVar16];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        uVar5 = *(uint *)((long)plVar1 + 0x14);
        uVar3 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)plVar1[4] * 8) + 0x40);
        uVar15 = pVVar10->nCap;
        if (pVVar10->nSize == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
            }
            iVar13 = 0x10;
          }
          else {
            iVar13 = uVar15 * 2;
            if (iVar13 <= (int)uVar15) goto LAB_002f4e2a;
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar15 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar15 << 4);
            }
          }
          pVVar10->pArray = ppvVar11;
          pVVar10->nCap = iVar13;
        }
LAB_002f4e2a:
        iVar13 = pVVar10->nSize;
        uVar15 = iVar13 + 1;
        pVVar10->nSize = uVar15;
        pVVar10->pArray[iVar13] = (void *)(uVar5 >> 10 & 1 ^ uVar3);
        if ((lVar14 < 0) || (local_420->vPis->nSize <= lVar14)) goto LAB_002f5080;
        pvVar4 = local_420->vPis->pArray[lVar14];
        uVar5 = pVVar10->nCap;
        if (uVar15 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
            }
            iVar13 = 0x10;
          }
          else {
            iVar13 = uVar5 * 2;
            if (iVar13 <= (int)uVar5) goto LAB_002f4ec0;
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar5 << 4);
            }
          }
          pVVar10->pArray = ppvVar11;
          pVVar10->nCap = iVar13;
        }
LAB_002f4ec0:
        iVar13 = pVVar10->nSize;
        pVVar10->nSize = iVar13 + 1;
        pVVar10->pArray[iVar13] = pvVar4;
        pAVar6 = local_420;
      }
      lVar16 = lVar16 + 1;
      pVVar12 = pNtk->vBoxes;
      in_RCX = (long)pVVar12->nSize;
      lVar14 = lVar14 + 1;
    } while (lVar16 < in_RCX);
  }
  pAVar9 = Abc_AigMiter((Abc_Aig_t *)pAVar6->pManFunc,pVVar10,0);
  if (pVVar10->pArray != (void **)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (void **)0x0;
  }
  free(pVVar10);
  if (0 < pAVar6->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pAVar6->vPos->pArray,(Abc_Obj_t *)((ulong)pAVar9 ^ 1));
    if (0 < pAVar6->vPos->nSize) {
      Abc_ObjAssignName((Abc_Obj_t *)*pAVar6->vPos->pArray,"rel",(char *)0x0);
      uVar5 = local_428;
      if (local_424 != 0) {
        iVar13 = pAVar6->vPis->nSize;
        if (iVar13 != pNtk->vPis->nSize + local_428) {
          __assert_fail("Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                        ,0xd5,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
        }
        if ((int)local_428 < iVar13) {
          do {
            pAVar6 = local_430;
            iVar13 = iVar13 + -1;
            Abc_NtkQuantify(local_430,0,iVar13,(int)in_RCX);
            Abc_NtkCleanData(pAVar6);
            Abc_AigCleanup((Abc_Aig_t *)pAVar6->pManFunc);
            Abc_NtkSynthesize(&local_430,1);
          } while ((int)uVar5 < iVar13);
        }
        pAVar6 = local_430;
        Abc_NtkCleanData(local_430);
        Abc_AigCleanup((Abc_Aig_t *)pAVar6->pManFunc);
        uVar15 = pAVar6->vPis->nSize;
        uVar17 = uVar15;
        for (; (int)uVar5 < (int)uVar15; uVar15 = uVar15 - 1) {
          uVar17 = uVar17 - 1;
          if (((int)uVar15 < 1) || (pAVar6->vPis->nSize < (int)uVar15)) goto LAB_002f5080;
          pAVar9 = (Abc_Obj_t *)pAVar6->vPis->pArray[uVar17];
          if ((pAVar9->vFanouts).nSize != 0) {
            __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                          ,0xea,"Abc_Ntk_t *Abc_NtkTransRel(Abc_Ntk_t *, int, int)");
          }
          Abc_NtkDeleteObj(pAVar9);
        }
      }
      pAVar6 = local_430;
      iVar13 = Abc_NtkCheck(local_430);
      if (iVar13 == 0) {
        puts("Abc_NtkTransRel: The network check has failed.");
        Abc_NtkDelete(pAVar6);
        pAVar6 = (Abc_Ntk_t *)0x0;
      }
      return pAVar6;
    }
  }
LAB_002f5080:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTransRel( Abc_Ntk_t * pNtk, int fInputs, int fVerbose )
{
    char Buffer[1000];
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pMiter;
    int i, nLatches;
    int fSynthesis = 1;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) );
    nLatches = Abc_NtkLatchNum(pNtk);
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    sprintf( Buffer, "%s_TR", pNtk->pName );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_NtkCleanCopy( pNtk );
    // create current state variables
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create next state variables
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtkNew), Abc_ObjName(pObj), NULL );
    // create PI variables
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create the PO
    Abc_NtkCreatePo( pNtkNew );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create the function of the primary output
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    vPairs = Vec_PtrAlloc( 2*nLatches );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPairs, Abc_NtkPi(pNtkNew, i+nLatches) );
    }
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkNew->pManFunc, vPairs, 0 );
    Vec_PtrFree( vPairs );
    // add the primary output
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), Abc_ObjNot(pMiter) );
    Abc_ObjAssignName( Abc_NtkPo(pNtkNew,0), "rel", NULL );

    // quantify inputs
    if ( fInputs )
    {
        assert( Abc_NtkPiNum(pNtkNew) == Abc_NtkPiNum(pNtk) + 2*nLatches );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
//        for ( i = 2*nLatches; i < Abc_NtkPiNum(pNtkNew); i++ )
        {
            Abc_NtkQuantify( pNtkNew, 0, i, fVerbose );
//            if ( fSynthesis && (i % 3 == 2) )
            if ( fSynthesis  )
            {
                Abc_NtkCleanData( pNtkNew );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
                Abc_NtkSynthesize( &pNtkNew, 1 );
            }
//            printf( "Var = %3d. Nodes = %6d. ", Abc_NtkPiNum(pNtkNew) - 1 - i, Abc_NtkNodeNum(pNtkNew) );
//            printf( "Var = %3d. Nodes = %6d. ", i - 2*nLatches, Abc_NtkNodeNum(pNtkNew) );
        }
//        printf( "\n" );
        Abc_NtkCleanData( pNtkNew );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
        for ( i = Abc_NtkPiNum(pNtkNew) - 1; i >= 2*nLatches; i-- )
        {
            pObj = Abc_NtkPi( pNtkNew, i );
            assert( Abc_ObjFanoutNum(pObj) == 0 );
            Abc_NtkDeleteObj( pObj );
        }
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkTransRel: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}